

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::SubroutineSymbol::serializeTo(SubroutineSymbol *this,ASTSerializer *serializer)

{
  ushort uVar1;
  size_t sVar2;
  pointer ppFVar3;
  Type *__n;
  size_t sVar4;
  Statement *__n_00;
  bitmask<slang::ast::MethodFlags> flags;
  long lVar5;
  string_view name;
  string local_48;
  
  __n = DeclaredType::getType(&this->declaredReturnType);
  ASTSerializer::write(serializer,10,"returnType",(size_t)__n);
  sVar4 = strlen(*(char **)(toString(slang::ast::VariableLifetime)::strings +
                           (long)(int)this->defaultLifetime * 8));
  ASTSerializer::write(serializer,0xf,"defaultLifetime",sVar4);
  sVar4 = strlen(*(char **)(toString(slang::ast::SubroutineKind)::strings +
                           (long)(int)this->subroutineKind * 8));
  ASTSerializer::write(serializer,0xe,"subroutineKind",sVar4);
  __n_00 = getBody(this);
  ASTSerializer::write(serializer,4,"body",(size_t)__n_00);
  sVar4 = strlen(*(char **)(toString(slang::ast::Visibility)::strings +
                           (long)(int)this->visibility * 8));
  ASTSerializer::write(serializer,10,"visibility",sVar4);
  name._M_str = "arguments";
  name._M_len = 9;
  ASTSerializer::startArray(serializer,name);
  sVar2 = (this->arguments)._M_extent._M_extent_value;
  if (sVar2 != 0) {
    ppFVar3 = (this->arguments)._M_ptr;
    lVar5 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Symbol **)((long)ppFVar3 + lVar5),false);
      lVar5 = lVar5 + 8;
    } while (sVar2 << 3 != lVar5);
  }
  ASTSerializer::endArray(serializer);
  uVar1 = (this->flags).m_bits;
  if (uVar1 != 0) {
    flagsToStr_abi_cxx11_(&local_48,(ast *)(ulong)uVar1,flags);
    ASTSerializer::write(serializer,5,"flags",(size_t)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void SubroutineSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("returnType", getReturnType());
    serializer.write("defaultLifetime", toString(defaultLifetime));
    serializer.write("subroutineKind", toString(subroutineKind));
    serializer.write("body", getBody());
    serializer.write("visibility", toString(visibility));

    serializer.startArray("arguments");
    for (auto arg : arguments)
        serializer.serialize(*arg);
    serializer.endArray();

    if (flags)
        serializer.write("flags", flagsToStr(flags));
}